

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

MOJOSHADER_irExpression * new_ir_constfloat(Context_conflict *ctx,float val)

{
  MOJOSHADER_irExpression *pMVar1;
  
  pMVar1 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x60,ctx->malloc_data);
  if (pMVar1 == (MOJOSHADER_irExpression *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
    pMVar1 = (MOJOSHADER_irExpression *)0x0;
  }
  else {
    (pMVar1->ir).type = MOJOSHADER_IR_CONSTANT;
    (pMVar1->ir).filename = ctx->sourcefile;
    (pMVar1->ir).line = ctx->sourceline;
    *(MOJOSHADER_astDataTypeType *)((long)pMVar1 + 0x18) = MOJOSHADER_AST_DATATYPE_FLOAT;
    *(int *)((long)pMVar1 + 0x1c) = 1;
    (pMVar1->temp).index = (int)val;
  }
  return pMVar1;
}

Assistant:

static MOJOSHADER_irExpression *new_ir_constfloat(Context *ctx, const float val)
{
    NEW_IR_EXPR(retval, MOJOSHADER_irConstant, MOJOSHADER_IR_CONSTANT, MOJOSHADER_AST_DATATYPE_FLOAT, 1);
    retval->value.fval[0] = val;
    return (MOJOSHADER_irExpression *) retval;
}